

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_DropItem
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClassActor *pPVar4;
  PClassActor *type;
  char *pcVar5;
  AActor *source;
  bool bVar6;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003decbf;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003deca6:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003decbf:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1675,
                  "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_003debe8;
    pPVar3 = (source->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (source->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar6 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar6) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003decbf;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_003deca6;
LAB_003debe8:
    source = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003decde;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003decaf:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003decde:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1676,
                  "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003dec46;
    pPVar4 = type;
    if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar4 = (PClassActor *)(pPVar4->super_PClass).ParentClass;
        if (pPVar4 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar4 != (PClassActor *)0x0);
      if (pPVar4 == (PClassActor *)0x0) {
        pcVar5 = "spawntype == NULL || spawntype->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_003decde;
      }
    }
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003decaf;
LAB_003dec46:
    type = (PClassActor *)0x0;
  }
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003ded06;
    }
    iVar2 = param[2].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_003ded06:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1677,
                    "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_003dec90;
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ded25;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_003dec90:
    P_DropItem(source,type,iVar2,param[3].field_0.i);
    return 0;
  }
  pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ded25:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1678,
                "int AF_AActor_A_DropItem(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DropItem)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS   (spawntype, AActor);
	PARAM_INT_DEF(amount);
	PARAM_INT_DEF(chance);

	P_DropItem(self, spawntype, amount, chance);
	return 0;
}